

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O3

bool labelling::operator==(Label *label1,Label *label2)

{
  double *pdVar1;
  double dVar2;
  pointer __s1;
  pointer piVar3;
  pointer __s2;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  
  if ((label1->vertex).lemon_id != (label2->vertex).lemon_id) {
    return false;
  }
  if ((label1->weight == label2->weight) && (!NAN(label1->weight) && !NAN(label2->weight))) {
    __s1 = (label1->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    piVar3 = (label1->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)piVar3 - (long)__s1;
    __s2 = (label2->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    if ((__n == (long)(label2->partial_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__s2) &&
       ((piVar3 == __s1 || (iVar5 = bcmp(__s1,__s2,__n), iVar5 == 0)))) {
      pdVar4 = (label1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(label1->resource_consumption).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar4;
      if (lVar6 == 0) {
        return true;
      }
      uVar7 = lVar6 >> 3;
      uVar8 = 0;
      while ((dVar2 = pdVar4[uVar8],
             pdVar1 = (label2->resource_consumption).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar8, dVar2 == *pdVar1 &&
             (!NAN(dVar2) && !NAN(*pdVar1)))) {
        uVar8 = uVar8 + 1;
        if (uVar7 + (uVar7 == 0) == uVar8) {
          return uVar7 <= uVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const Label& label1, const Label& label2) {
  if (label1.vertex.lemon_id != label2.vertex.lemon_id)
    return false;
  if (label1.weight != label2.weight)
    return false;
  if (label1.partial_path != label2.partial_path)
    return false;
  /// Check every resource for inequality
  for (int i = 0; i < label1.resource_consumption.size(); i++) {
    if (label1.resource_consumption[i] != label2.resource_consumption[i]) {
      return false;
    }
  }
  return true;
}